

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef lj_opt_cse(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  long in_RDI;
  IRIns *ir;
  IRRef ref_1;
  IRRef lim;
  IRRef ref;
  IROp op;
  IRRef2 op12;
  IRRef ref_2;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_28;
  uint local_24;
  
  iVar3 = (uint)*(ushort *)(in_RDI + 0xa0) + (uint)*(ushort *)(in_RDI + 0xa2) * 0x10000;
  uVar4 = (uint)*(byte *)(in_RDI + 0xa5);
  if ((*(uint *)(in_RDI + 0x90) & 0x20000) != 0) {
    uVar1 = *(ushort *)(in_RDI + 0x182 + (ulong)uVar4 * 2);
    local_28 = (uint)*(ushort *)(in_RDI + 0xa0);
    if (local_28 < *(ushort *)(in_RDI + 0xa2)) {
      local_28 = (uint)*(ushort *)(in_RDI + 0xa2);
    }
    while (local_24 = (uint)uVar1, local_28 < local_24) {
      if (*(int *)(*(long *)(in_RDI + 0x10) + (ulong)local_24 * 8) == iVar3) {
        return local_24 +
               (uint)*(byte *)(*(long *)(in_RDI + 0x10) + 4 + (ulong)local_24 * 8) * 0x1000000;
      }
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)local_24 * 8);
    }
  }
  uVar2 = *(uint *)(in_RDI + 8);
  if (*(uint *)(in_RDI + 0x140) <= uVar2) {
    lj_ir_growtop((jit_State *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  *(uint *)(in_RDI + 8) = uVar2 + 1;
  piVar5 = (int *)(*(long *)(in_RDI + 0x10) + (ulong)uVar2 * 8);
  *(undefined2 *)((long)piVar5 + 6) = *(undefined2 *)(in_RDI + 0x182 + (ulong)uVar4 * 2);
  *piVar5 = iVar3;
  *(short *)(in_RDI + 0x182 + (ulong)uVar4 * 2) = (short)uVar2;
  *(undefined1 *)((long)piVar5 + 5) = *(undefined1 *)(in_RDI + 0xa5);
  *(byte *)(in_RDI + 0x9e) = *(byte *)(in_RDI + 0x9e) | *(byte *)(in_RDI + 0xa4);
  *(undefined1 *)(piVar5 + 1) = *(undefined1 *)(in_RDI + 0xa4);
  return uVar2 + (uint)*(byte *)(piVar5 + 1) * 0x1000000;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cse(jit_State *J)
{
  /* Avoid narrow to wide store-to-load forwarding stall */
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  IROp op = fins->o;
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    /* Limited search for same operands in per-opcode chain. */
    IRRef ref = J->chain[op];
    IRRef lim = fins->op1;
    if (fins->op2 > lim) lim = fins->op2;  /* Relies on lit < REF_BIAS. */
    while (ref > lim) {
      if (IR(ref)->op12 == op12)
	return TREF(ref, irt_t(IR(ref)->t));  /* Common subexpression found. */
      ref = IR(ref)->prev;
    }
  }
  /* Otherwise emit IR (inlined for speed). */
  {
    IRRef ref = lj_ir_nextins(J);
    IRIns *ir = IR(ref);
    ir->prev = J->chain[op];
    ir->op12 = op12;
    J->chain[op] = (IRRef1)ref;
    ir->o = fins->o;
    J->guardemit.irt |= fins->t.irt;
    return TREF(ref, irt_t((ir->t = fins->t)));
  }
}